

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O1

bool __thiscall HydEngine::isPressureDeficient(HydEngine *this)

{
  pointer ppNVar1;
  uint uVar2;
  ostream *poVar3;
  int iVar4;
  ostringstream *this_00;
  pointer ppNVar5;
  
  ppNVar1 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (ppNVar5 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar5 != ppNVar1; ppNVar5 = ppNVar5 + 1) {
    uVar2 = (*((*ppNVar5)->super_Element)._vptr_Element[9])(*ppNVar5,this->network);
    iVar4 = iVar4 + (uVar2 & 0xff);
  }
  if ((0 < iVar4) && ((this->network->options).indexOptions[0xe] != 0)) {
    this_00 = &this->network->msgLog;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n\n    ",6);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)this_00,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,s_Deficient_abi_cxx11_._M_dataplus._M_p,
               s_Deficient_abi_cxx11_._M_string_length);
  }
  return 0 < iVar4;
}

Assistant:

bool HydEngine::isPressureDeficient()
{
    int count = 0;
    for (Node* node : network->nodes)
    {
        // ... This only gets evaluated for the CONSTRAINED demand model
        if ( node->isPressureDeficient(network) ) count++;
    }
    if ( count > 0 && network->option(Options::REPORT_TRIALS) )
    {
        network->msgLog << "\n\n    " << count << s_Deficient;
    }
    return (count > 0);
}